

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          String *rest_1,ArrayPtr<const_char> *rest_2)

{
  Array<kj::StringTree::Branch> *pAVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pcVar5;
  ArrayDisposer *pAVar6;
  Branch *pBVar7;
  size_t __n;
  char *pcVar8;
  size_t sVar9;
  
  pcVar8 = (char *)(this->text).content.size_;
  if (pcVar8 != (char *)0x0) {
    pcVar8 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar8;
  sVar2 = (first->content).size_;
  sVar9 = 0;
  if (sVar2 != 0) {
    sVar9 = sVar2 - 1;
  }
  pcVar8 = (first->content).ptr;
  pAVar3 = (first->content).disposer;
  (first->content).ptr = (char *)0x0;
  (first->content).size_ = 0;
  pBVar4 = (this->branches).ptr;
  pBVar4[branchIndex].content.size_ = sVar9;
  pcVar5 = pBVar4[branchIndex].content.text.content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar9 = pBVar4[branchIndex].content.text.content.size_;
    pBVar4[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar4[branchIndex].content.text.content.size_ = 0;
    pAVar6 = pBVar4[branchIndex].content.text.content.disposer;
    (**pAVar6->_vptr_ArrayDisposer)(pAVar6,pcVar5,1,sVar9,sVar9,0);
  }
  pBVar4[branchIndex].content.text.content.ptr = pcVar8;
  pBVar4[branchIndex].content.text.content.size_ = sVar2;
  pBVar4[branchIndex].content.text.content.disposer = pAVar3;
  pAVar1 = &pBVar4[branchIndex].content.branches;
  pBVar7 = pBVar4[branchIndex].content.branches.ptr;
  if (pBVar7 != (Branch *)0x0) {
    sVar2 = pBVar4[branchIndex].content.branches.size_;
    pAVar1->ptr = (Branch *)0x0;
    pBVar4[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar4[branchIndex].content.branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar7,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pAVar1->ptr = (Branch *)0x0;
  pBVar4[branchIndex].content.branches.size_ = 0;
  pBVar4[branchIndex].content.branches.disposer = (ArrayDisposer *)0x0;
  __n = rest->size_;
  if (__n != 0) {
    memcpy(pos,rest->ptr,__n);
    pos = pos + __n;
  }
  fill<kj::ArrayPtr<char_const>>(this,pos,branchIndex + 1,rest_1,rest_2);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}